

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict
sexp_integer_length(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  sexp_uint_t sVar1;
  sexp_uint_t sVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_sint_t hi;
  sexp_sint_t tmp;
  sexp_uint_t in_stack_ffffffffffffffc8;
  sexp_conflict local_8;
  
  if (((ulong)in_RCX & 1) == 1) {
    sVar1 = integer_log2(in_stack_ffffffffffffffc8);
    local_8 = (sexp_conflict)(sVar1 << 1 | 1);
  }
  else if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0xc)) {
    sVar1 = sexp_bignum_hi(in_RCX);
    sVar2 = integer_log2(sVar1);
    local_8 = (sexp_conflict)((sVar2 + (sVar1 - 1) * 0x40) * 2 | 1);
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_integer_length (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  sexp_sint_t tmp;
#if SEXP_USE_BIGNUMS
  sexp_sint_t hi;
#endif
  if (sexp_fixnump(x)) {
    tmp = sexp_unbox_fixnum(x);
    return sexp_make_fixnum(integer_log2(tmp < 0 ? -tmp-1 : tmp));
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    hi = sexp_bignum_hi(x);
    return sexp_make_fixnum(integer_log2(sexp_bignum_data(x)[hi-1])
                            + (hi-1)*sizeof(sexp_uint_t)*CHAR_BIT);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}